

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

Vec_Int_t * Ga2_ManAbsDerive(Gia_Man_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  Vec_Int_t *p_01;
  bool bVar2;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vToAdd;
  Gia_Man_t *p_local;
  
  p_01 = Vec_IntAlloc(1000);
  local_24 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar2 = false;
    if (local_24 < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      pGStack_20 = Gia_ManCi(p,iVar1 + local_24);
      bVar2 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    if (*(long *)pGStack_20 < 0) {
      p_00 = p->vGateClasses;
      iVar1 = Gia_ObjId(p,pGStack_20);
      iVar1 = Vec_IntEntry(p_00,iVar1);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjId(p,pGStack_20);
        Vec_IntPush(p_01,iVar1);
      }
    }
    local_24 = local_24 + 1;
  }
  local_24 = 0;
  while( true ) {
    bVar2 = false;
    if (local_24 < p->nObjs) {
      pGStack_20 = Gia_ManObj(p,local_24);
      bVar2 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjIsAnd(pGStack_20);
    if (((iVar1 != 0) && (*(long *)pGStack_20 < 0)) &&
       (iVar1 = Vec_IntEntry(p->vGateClasses,local_24), iVar1 != 0)) {
      Vec_IntPush(p_01,local_24);
    }
    local_24 = local_24 + 1;
  }
  return p_01;
}

Assistant:

Vec_Int_t * Ga2_ManAbsDerive( Gia_Man_t * p )
{
    Vec_Int_t * vToAdd;
    Gia_Obj_t * pObj;
    int i;
    vToAdd = Vec_IntAlloc( 1000 );
    Gia_ManForEachRo( p, pObj, i )
        if ( pObj->fPhase && Vec_IntEntry(p->vGateClasses, Gia_ObjId(p, pObj)) )
            Vec_IntPush( vToAdd, Gia_ObjId(p, pObj) );
    Gia_ManForEachAnd( p, pObj, i )
        if ( pObj->fPhase && Vec_IntEntry(p->vGateClasses, i) )
            Vec_IntPush( vToAdd, i );
    return vToAdd;
}